

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Sum * __thiscall
lossless_neural_sound::expression_compiler::Arena::
create<lossless_neural_sound::expression_compiler::expression::Sum,lossless_neural_sound::expression_compiler::expression::Sum>
          (Arena *this,Sum *args)

{
  Node_base *pNVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Expression_node *pEVar5;
  Expression_node *pEVar6;
  size_t sVar7;
  Node_base *pNVar8;
  _Elt_pointer puVar9;
  
  puVar9 = (this->small_nodes).
           super__Deque_base<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar9 == (this->small_nodes).
                super__Deque_base<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
    ::_M_push_back_aux<>(&this->small_nodes);
    puVar9 = (this->small_nodes).
             super__Deque_base<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  }
  else {
    (puVar9->_M_t).
    super___uniq_ptr_impl<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
    ._M_t.
    super__Tuple_impl<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
    .super__Head_base<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_false>.
    _M_head_impl = (Node_base *)0x0;
    puVar9 = puVar9 + 1;
    (this->small_nodes).
    super__Deque_base<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = puVar9;
  }
  if (puVar9 == (this->small_nodes).
                super__Deque_base<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar9 = (this->small_nodes).
             super__Deque_base<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pNVar8 = (Node_base *)
           allocate<lossless_neural_sound::expression_compiler::Arena::Node<lossless_neural_sound::expression_compiler::expression::Sum>>
                     (this);
  pNVar8->_vptr_Node_base = (_func_int **)&PTR__Node_00127b58;
  pNVar8[2]._vptr_Node_base =
       (_func_int **)
       (args->super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>).
       super_Expression_node.super_Node.hash_next;
  pNVar8[1]._vptr_Node_base = (_func_int **)&PTR__Node_00127808;
  pNVar8[7]._vptr_Node_base =
       (_func_int **)
       (args->super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>).
       super_Expression_node.aa_tree_node.tree_level;
  pEVar5 = (args->super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>).
           super_Expression_node.aa_tree_node.parent;
  pEVar6 = (args->super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>).
           super_Expression_node.aa_tree_node.left_child;
  uVar2 = *(undefined4 *)
           ((long)&(args->
                   super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>)
                   .super_Expression_node.aa_tree_node.right_child + 4);
  sVar7 = (args->super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>).
          super_Expression_node.aa_tree_node.tree_size;
  uVar3 = *(undefined4 *)
           ((long)&(args->
                   super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>)
                   .super_Expression_node.aa_tree_node.tree_size + 4);
  *(undefined4 *)&pNVar8[5]._vptr_Node_base =
       *(undefined4 *)
        &(args->super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>).
         super_Expression_node.aa_tree_node.right_child;
  *(undefined4 *)((long)&pNVar8[5]._vptr_Node_base + 4) = uVar2;
  *(int *)&pNVar8[6]._vptr_Node_base = (int)sVar7;
  *(undefined4 *)((long)&pNVar8[6]._vptr_Node_base + 4) = uVar3;
  pNVar8[3]._vptr_Node_base = (_func_int **)pEVar5;
  pNVar8[4]._vptr_Node_base = (_func_int **)pEVar6;
  pNVar8[1]._vptr_Node_base = (_func_int **)&PTR__Node_00127ae0;
  uVar2 = *(undefined4 *)
           ((long)&(args->
                   super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>)
                   .left_node + 4);
  uVar3 = *(undefined4 *)
           &(args->super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>)
            .right_node;
  uVar4 = *(undefined4 *)
           ((long)&(args->
                   super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>)
                   .right_node + 4);
  *(undefined4 *)&pNVar8[8]._vptr_Node_base =
       *(undefined4 *)
        &(args->super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>).
         left_node;
  *(undefined4 *)((long)&pNVar8[8]._vptr_Node_base + 4) = uVar2;
  *(undefined4 *)&pNVar8[9]._vptr_Node_base = uVar3;
  *(undefined4 *)((long)&pNVar8[9]._vptr_Node_base + 4) = uVar4;
  pNVar8[1]._vptr_Node_base = (_func_int **)&PTR__Node_00127a38;
  pNVar1 = puVar9[-1]._M_t.
           super___uniq_ptr_impl<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
           ._M_t.
           super__Tuple_impl<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
           .
           super__Head_base<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_false>
           ._M_head_impl;
  puVar9[-1]._M_t.
  super___uniq_ptr_impl<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
  ._M_t.
  super__Tuple_impl<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
  .super__Head_base<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_false>.
  _M_head_impl = pNVar8;
  if (pNVar1 != (Node_base *)0x0) {
    (**pNVar1->_vptr_Node_base)();
    pNVar8 = puVar9[-1]._M_t.
             super___uniq_ptr_impl<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
             ._M_t.
             super__Tuple_impl<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
             .
             super__Head_base<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_false>
             ._M_head_impl;
  }
  return (Sum *)(pNVar8 + 1);
}

Assistant:

T *create(Args &&... args)
    {
        if(sizeof(Node<T>) >= big_memory_block_start_size)
        {
            big_nodes.emplace_back(); // allocate slot first
            auto &retval = big_nodes.back();
            retval.reset(new Node<T>(std::forward<Args>(args)...));
            return std::addressof(static_cast<Node<T> *>(retval.get())->value);
        }
        if(std::is_trivially_destructible<T>::value)
        {
            // don't need to keep in small_nodes because we don't need to call the destructor
            return new(allocate<T>()) T(std::forward<Args>(args)...);
        }
        small_nodes.emplace_back(); // allocate slot first
        auto &retval = small_nodes.back();
        retval.reset(new(allocate<Node<T>>()) Node<T>(std::forward<Args>(args)...));
        return std::addressof(static_cast<Node<T> *>(retval.get())->value);
    }